

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall rengine::RectangleNodeBase::setGeometry(RectangleNodeBase *this,rect2d rect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar3 = rect.tl.x;
  fVar4 = rect.tl.y;
  fVar1 = *(float *)&(this->super_Node).field_0x34;
  fVar2 = *(float *)&this->field_0x38;
  fVar6 = rect.br.x - fVar3;
  fVar7 = rect.br.y - fVar4;
  fVar8 = *(float *)&this->field_0x3c - fVar1;
  fVar5 = *(float *)&this->field_0x40 - fVar2;
  if ((fVar3 == fVar1) && (!NAN(fVar3) && !NAN(fVar1))) {
    if ((fVar4 == fVar2) && (!NAN(fVar4) && !NAN(fVar2))) {
      if ((fVar6 == fVar8) && (!NAN(fVar6) && !NAN(fVar8))) {
        if ((fVar7 == fVar5) && (!NAN(fVar7) && !NAN(fVar5))) {
          return;
        }
      }
    }
  }
  *(rect2d *)&(this->super_Node).field_0x34 = rect;
  if ((fVar3 != fVar1) || (NAN(fVar3) || NAN(fVar1))) {
    Signal<>::emit(&onXChanged,(SignalEmitter *)this);
  }
  if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
    Signal<>::emit(&onYChanged,(SignalEmitter *)this);
  }
  if ((fVar6 != fVar8) || (NAN(fVar6) || NAN(fVar8))) {
    Signal<>::emit(&onWidthChanged,(SignalEmitter *)this);
  }
  if ((fVar7 == fVar5) && (!NAN(fVar7) && !NAN(fVar5))) {
    return;
  }
  Signal<>::emit(&onHeightChanged,(SignalEmitter *)this);
  return;
}

Assistant:

void setGeometry(rect2d rect) {
        bool updateX = rect.x() != m_geometry.x();
        bool updateY = rect.y() != m_geometry.y();
        bool updateW = rect.width() != m_geometry.width();
        bool updateH = rect.height() != m_geometry.height();
        if (!updateX && !updateY && !updateW && !updateH)
            return;
        m_geometry = rect;
        if (updateX) onXChanged.emit(this);
        if (updateY) onYChanged.emit(this);
        if (updateW) onWidthChanged.emit(this);
        if (updateH) onHeightChanged.emit(this);
    }